

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
          (ModelBaseEKFFlexEstimatorIMU *this,uint i)

{
  uint uVar1;
  uint i_local;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  IMUElasticLocalFrameDynamicalSystem::setContactsNumber(&this->functor_,i);
  uVar1 = IMUElasticLocalFrameDynamicalSystem::getInputSize(&this->functor_);
  this->inputSize_ = uVar1;
  ZeroDelayObserver::setInputSize
            ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,this->inputSize_);
  if ((this->useFTSensors_ & 1U) != 0) {
    uVar1 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(&this->functor_);
    KalmanFilterBase::setMeasureSize
              (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,uVar1);
    (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
      _vptr_FlexibilityEstimatorBase[0x44])();
  }
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setContactsNumber(unsigned i)
    {
        functor_.setContactsNumber(i);

        inputSize_ = functor_.getInputSize();
        ekf_.setInputSize(inputSize_);

        if (useFTSensors_)
        {
          ekf_.setMeasureSize(functor_.getMeasurementSize());
          updateMeasurementCovarianceMatrix_();
        }
    }